

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg3s.cc
# Opt level: O0

void __thiscall trng::mrg3s::mrg3s(mrg3s *this,unsigned_long s,parameter_type P)

{
  int in_ECX;
  undefined8 in_RDX;
  unsigned_long in_RSI;
  mrg3s *in_RDI;
  
  *(undefined8 *)(in_RDI->P).a = in_RDX;
  (in_RDI->P).a[2] = in_ECX;
  mrg_status<int,_3,_trng::mrg3s>::mrg_status(&in_RDI->S);
  seed(in_RDI,in_RSI);
  return;
}

Assistant:

mrg3s::mrg3s(unsigned long s, mrg3s::parameter_type P) : P{P} { seed(s); }